

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

Matrix * MatrixIdentity(uint32_t n)

{
  undefined1 value [16];
  undefined6 in_stack_ffffffffffffffd2;
  uint local_24;
  uint32_t index;
  Matrix *new;
  Matrix *pMStack_10;
  uint32_t n_local;
  
  if (n == 0) {
    fprintf(_stderr,"%s: Invalid dimension (0x0 >= 1x1)\n","MatrixIdentity");
    pMStack_10 = (Matrix *)0x0;
  }
  else {
    pMStack_10 = MatrixZero(n,n);
    for (local_24 = 0; local_24 < n; local_24 = local_24 + 1) {
      value._10_6_ = in_stack_ffffffffffffffd2;
      value._0_10_ = (longdouble)1;
      MatrixSetElement(pMStack_10,local_24,local_24,(Real)value);
    }
  }
  return pMStack_10;
}

Assistant:

Matrix *MatrixIdentity(uint32_t n) {
#ifndef NDEBUG
  if (n == 0) {
    fprintf(stderr, "%s: Invalid dimension (0x0 >= 1x1)\n", __FUNCTION_NAME__);
    return NULL;
  }
#endif
  Matrix *new = MatrixZero(n, n);
  /*
   * n=1 -> 0
   * n=2 -> 0,3
   * n=3 -> 0,4,8
   * n=4 -> 0,5,10,15
   * n=x -> 0,x+1,2*(x+1),3*(n+1),...
   */
  for (uint32_t index = 0; index < n; ++index) {
    MatrixSetElement(new, index, index, 1);
  }
  return new;
}